

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void Assimp::FBX::ResolveVertexDataArray<aiVector3t<float>>
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  pointer pcVar1;
  uint uVar2;
  pointer paVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  pointer paVar6;
  undefined8 uVar7;
  float fVar8;
  Scope *pSVar9;
  char *pcVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  Element *pEVar14;
  long lVar15;
  pointer piVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  byte bVar23;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator<char> local_229;
  string local_228;
  Scope *local_200;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_1f8;
  vector<int,_std::allocator<int>_> local_1d8;
  char *local_1c0;
  char *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = source;
  local_1b8 = dataElementName;
  iVar12 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1b0 = ReferenceInformationType;
  iVar13 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  bVar11 = true;
  bVar19 = true;
  if (iVar13 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,indexDataElementName,(allocator<char> *)&local_228);
    bVar11 = HasElement(local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar19 = !bVar11;
  }
  bVar23 = iVar12 != 0 & bVar11;
  local_1c0 = indexDataElementName;
  iVar12 = std::__cxx11::string::compare((char *)MappingInformationType);
  pcVar10 = local_1b8;
  if ((bVar23 == 0) && (iVar12 == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,local_1b8,(allocator<char> *)&local_228);
    pSVar9 = local_200;
    bVar19 = HasElement(local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar19) {
      return;
    }
    local_228._M_dataplus._M_p = (pointer)0x0;
    local_228._M_string_length = 0;
    local_228.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,pcVar10,(allocator<char> *)&local_1f8);
    pEVar14 = GetRequiredElement(pSVar9,(string *)local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_228,pEVar14)
    ;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (data_out,vertex_count);
    _Var5._M_p = local_228._M_dataplus._M_p;
    uVar7 = local_228.field_2._M_allocated_capacity;
    if (local_228._M_string_length - (long)local_228._M_dataplus._M_p != 0) {
      lVar15 = ((long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 2) *
               -0x5555555555555555;
      lVar17 = 0;
      do {
        uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar17];
        uVar18 = (ulong)uVar2;
        uVar20 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar17] + uVar2;
        if (uVar2 < uVar20) {
          do {
            uVar2 = (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar18];
            paVar3 = (data_out->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar3[uVar2].z = *(float *)(local_228._M_dataplus._M_p + lVar17 * 0xc + 8);
            uVar4 = *(undefined8 *)(local_228._M_dataplus._M_p + lVar17 * 0xc);
            paVar3 = paVar3 + uVar2;
            paVar3->x = (float)(int)uVar4;
            paVar3->y = (float)(int)((ulong)uVar4 >> 0x20);
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar15 + (ulong)(lVar15 == 0));
    }
  }
  else {
    iVar12 = std::__cxx11::string::compare((char *)MappingInformationType);
    if ((bool)(iVar12 != 0 | bVar19)) {
      iVar12 = std::__cxx11::string::compare((char *)MappingInformationType);
      if (bVar23 == 0 && iVar12 == 0) {
        local_228._M_dataplus._M_p = (pointer)0x0;
        local_228._M_string_length = 0;
        local_228.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,local_1b8,(allocator<char> *)&local_1f8);
        pEVar14 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_228,
                   pEVar14);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (((long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 2) *
            -0x5555555555555555 - vertex_count == 0) {
          _Var5._M_p = (pointer)(data_out->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_dataplus._M_p;
          paVar3 = (data_out->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar7 = (data_out->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._M_string_length;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_228.field_2._M_allocated_capacity;
          local_228._M_dataplus._M_p = _Var5._M_p;
          local_228._M_string_length = (size_type)paVar3;
          local_228.field_2._M_allocated_capacity = uVar7;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          _Var5._M_p = local_228._M_dataplus._M_p;
          uVar7 = local_228.field_2._M_allocated_capacity;
        }
        goto joined_r0x005f481c;
      }
      iVar12 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((bool)(bVar19 | iVar12 != 0)) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,local_1b0->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return;
      }
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1b8,(allocator<char> *)&local_228);
      pSVar9 = local_200;
      pEVar14 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
      pcVar10 = local_1c0;
      ParseVectorDataArray(&local_1f8,pEVar14);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (data_out,vertex_count);
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar10,(allocator<char> *)&local_228);
      pEVar14 = GetRequiredElement(pSVar9,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1d8,pEVar14);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar18 = 0;
          piVar16 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar21 = (ulong)*piVar16;
            if (uVar21 == 0xffffffffffffffff) {
              paVar6 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3 = paVar6 + uVar18;
              paVar3->x = 0.0;
              paVar3->y = 0.0;
              paVar6[uVar18].z = 0.0;
            }
            else {
              uVar22 = ((long)local_1f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
              if (uVar22 < uVar21 || uVar22 - uVar21 == 0) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_228,local_1c0,&local_229);
                pEVar14 = GetRequiredElement(local_200,&local_228,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar14);
              }
              paVar3 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3[uVar18].z =
                   local_1f8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar21].z;
              fVar8 = local_1f8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar21].y;
              paVar3 = paVar3 + uVar18;
              paVar3->x = local_1f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].x;
              paVar3->y = fVar8;
            }
            uVar18 = (ulong)((int)uVar18 + 1);
            piVar16 = piVar16 + 1;
          } while (piVar16 !=
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x5f4b40);
      }
    }
    else {
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1b8,(allocator<char> *)&local_228);
      pSVar9 = local_200;
      pEVar14 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1f8,pEVar14);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (data_out,vertex_count);
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1c0,(allocator<char> *)&local_228);
      pEVar14 = GetRequiredElement(pSVar9,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1d8,pEVar14);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar15 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar17 = 0;
        do {
          uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar17];
          uVar18 = (ulong)uVar2;
          uVar20 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar17] + uVar2;
          if (uVar2 < uVar20) {
            do {
              uVar21 = (ulong)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar17];
              uVar22 = ((long)local_1f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
              if (uVar22 < uVar21 || uVar22 - uVar21 == 0) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_228,local_1c0,&local_229);
                pEVar14 = GetRequiredElement(local_200,&local_228,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar14);
              }
              uVar2 = (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar18];
              paVar3 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3[uVar2].z =
                   local_1f8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar21].z;
              fVar8 = local_1f8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar21].y;
              paVar3 = paVar3 + uVar2;
              paVar3->x = local_1f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].x;
              paVar3->y = fVar8;
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != lVar15 + (ulong)(lVar15 == 0));
      }
    }
    _Var5._M_p = (pointer)local_1f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var5._M_p = (pointer)local_1f8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
joined_r0x005f481c:
  if ((pointer)_Var5._M_p != (pointer)0x0) {
    operator_delete(_Var5._M_p,uVar7 - (long)_Var5._M_p);
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}